

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

void __thiscall cmDebugger_impl::cmDebugger_impl(cmDebugger_impl *this,cmake *cmakeInstance)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_cmDebugger)._vptr_cmDebugger = (_func_int **)&PTR_GetBacktrace_0068a800;
  this->CMakeInstance = cmakeInstance;
  (this->state)._M_i = Unknown;
  *(undefined8 *)((long)&(this->m).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->m).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->m).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  std::_V2::condition_variable_any::condition_variable_any(&this->cv);
  (this->Lock)._M_device = &this->m;
  (this->Lock)._M_owns = false;
  std::unique_lock<std::recursive_timed_mutex>::lock(&this->Lock);
  (this->Lock)._M_owns = true;
  this->breakPending = (__atomic_base<bool>)0x1;
  this->continuePending = (__atomic_base<bool>)0x0;
  (this->breakpointMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->breakpointMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->breakpointMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->breakpointMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->breakpointMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->breakDepth = -1;
  p_Var1 = &(this->listeners)._M_t._M_impl.super__Rb_tree_header;
  (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->currentLocation).Name._M_dataplus._M_p = (pointer)&(this->currentLocation).Name.field_2;
  (this->currentLocation).Name._M_string_length = 0;
  (this->currentLocation).Name.field_2._M_local_buf[0] = '\0';
  (this->currentLocation).FilePath._M_dataplus._M_p =
       (pointer)&(this->currentLocation).FilePath.field_2;
  (this->currentLocation).FilePath._M_string_length = 0;
  (this->currentLocation).FilePath.field_2._M_local_buf[0] = '\0';
  (this->currentLocation).Line = 0;
  this->BreakOnError = true;
  p_Var1 = &(this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header;
  (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nextBreakId = 1;
  return;
}

Assistant:

cmDebugger_impl(cmake& cmakeInstance)
    : CMakeInstance(cmakeInstance)
    , Lock(m)
  {
  }